

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Split
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out1,uint32_t startXOut1,
               uint32_t startYOut1,Image *out2,uint32_t startXOut2,uint32_t startYOut2,Image *out3,
               uint32_t startXOut3,uint32_t startYOut3,uint32_t width,uint32_t height)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  long lVar11;
  uchar *puVar12;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out1,startXOut1,startYOut1,out2,startXOut2,startYOut2,out3,startXOut3,startYOut3,width,
             height);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  local_58._data = (uchar *)0x0;
  local_58._type = out2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  local_80._data = (uchar *)0x0;
  local_80._type = out3->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out3,src_00);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (out1,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar2 = in->_rowSize;
  if (height * uVar2 != 0) {
    puVar6 = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar2);
    uVar3 = out3->_rowSize;
    puVar7 = puVar6 + height * uVar2;
    puVar8 = out3->_data + (ulong)startXOut3 + (ulong)(startYOut3 * uVar3);
    uVar4 = out2->_rowSize;
    puVar9 = out2->_data + (ulong)startXOut2 + (ulong)(startYOut2 * uVar4);
    uVar5 = out1->_rowSize;
    puVar10 = out1->_data + (ulong)startXOut1 + (ulong)(startYOut1 * uVar5);
    do {
      if (width != 0) {
        lVar11 = 0;
        puVar12 = puVar6;
        do {
          puVar10[lVar11] = *puVar12;
          puVar9[lVar11] = puVar12[1];
          puVar1 = puVar12 + 2;
          puVar12 = puVar12 + 3;
          puVar8[lVar11] = *puVar1;
          lVar11 = lVar11 + 1;
        } while (puVar12 != puVar6 + width * 3);
      }
      puVar6 = puVar6 + uVar2;
      puVar10 = puVar10 + uVar5;
      puVar9 = puVar9 + uVar4;
      puVar8 = puVar8 + uVar3;
    } while (puVar6 != puVar7);
  }
  return;
}

Assistant:

void Split( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out1, uint32_t startXOut1, uint32_t startYOut1,
                Image & out2, uint32_t startXOut2, uint32_t startYOut2, Image & out3, uint32_t startXOut3, uint32_t startYOut3,
                uint32_t width, uint32_t height )
    {
        ParameterValidation ( in, startXIn, startYIn, width, height );
        ParameterValidation ( out1, startXOut1, startYOut1, out2, startXOut2, startYOut2, out3, startXOut3, startYOut3, width, height );
        VerifyRGBImage      ( in );
        VerifyGrayScaleImage( out1, out2, out3 );

        const uint8_t colorCount = RGB;

        const uint32_t rowSizeIn   = in.rowSize();
        const uint32_t rowSizeOut1 = out1.rowSize();
        const uint32_t rowSizeOut2 = out2.rowSize();
        const uint32_t rowSizeOut3 = out3.rowSize();

        width = width * colorCount;

        const uint8_t * inY = in.data() + startYIn * rowSizeIn + startXIn * colorCount;
        uint8_t * out1Y = out1.data() + startYOut1 * rowSizeOut1 + startXOut1;
        uint8_t * out2Y = out2.data() + startYOut2 * rowSizeOut2 + startXOut2;
        uint8_t * out3Y = out3.data() + startYOut3 * rowSizeOut3 + startXOut3;

        const uint8_t * inYEnd = inY + height * rowSizeIn;

        for( ; inY != inYEnd; inY += rowSizeIn, out1Y += rowSizeOut1, out2Y += rowSizeOut2, out3Y += rowSizeOut3 ) {
            const uint8_t * inX = inY;
            uint8_t * out1X = out1Y;
            uint8_t * out2X = out2Y;
            uint8_t * out3X = out3Y;

            const uint8_t * inXEnd = inX + width;

            for( ; inX != inXEnd; ) {
                *(out1X++) = *(inX++);
                *(out2X++) = *(inX++);
                *(out3X++) = *(inX++);
            }
        }
    }